

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void DefaultFormatter::Unser<DataStream,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               (DataStream *s,vector<unsigned_char,_std::allocator<unsigned_char>_> *t)

{
  long lVar1;
  pointer puVar2;
  uint uVar3;
  uint64_t uVar4;
  size_t in_RCX;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = (t->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((t->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (t->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  uVar4 = ReadCompactSize<DataStream>(s,true);
  uVar7 = (uint)uVar4;
  if (uVar7 != 0) {
    uVar5 = 0;
    do {
      uVar3 = uVar7 - uVar5;
      if (4999999 < uVar7 - uVar5) {
        uVar3 = 5000000;
      }
      uVar6 = uVar3 + uVar5;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(t,(ulong)uVar6);
      DataStream::read(s,uVar5 + (int)(t->
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      )._M_impl.super__Vector_impl_data._M_start,
                       (void *)(ulong)uVar3,in_RCX);
      uVar5 = uVar6;
    } while (uVar6 < uVar7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void Unser(Stream& s, T& t) { Unserialize(s, t); }